

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O0

void * __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveSimple>::newSet
          (STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveSimple>
           *this)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveSimple> *this_local
  ;
  
  this_00 = (set<int,_std::less<int>,_std::allocator<int>_> *)operator_new(0x30);
  memset(this_00,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(this_00);
  return this_00;
}

Assistant:

void* STLSetImplement<Set, Base>::newSet() {
	return new Set();
}